

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int WebRtcIsac_DecodeUb16
              (TransformTables *transform_tables,float *signal_out,ISACUBDecStruct *ISACdecUB_obj,
              int16_t isRCUPayload)

{
  int16_t iVar1;
  int local_2050;
  int n;
  int16_t kAveragePitchGain;
  double imag_f [240];
  double real_f [240];
  double percepFilterParam [65];
  double local_f38;
  double halfFrameSecond [240];
  double halfFrameFirst [240];
  int err;
  int len;
  int16_t isRCUPayload_local;
  ISACUBDecStruct *ISACdecUB_obj_local;
  float *signal_out_local;
  TransformTables *transform_tables_local;
  
  memset(real_f + 0xef,0,0x208);
  iVar1 = WebRtcIsac_DecodeInterpolLpcUb(&ISACdecUB_obj->bitstr_obj,real_f + 0xef,0x10);
  transform_tables_local._4_4_ = (int)iVar1;
  if ((-1 < transform_tables_local._4_4_) &&
     (transform_tables_local._4_4_ =
           WebRtcIsac_DecodeSpec
                     (&ISACdecUB_obj->bitstr_obj,0,kIsacUpperBand16,imag_f + 0xef,(double *)&n),
     -1 < transform_tables_local._4_4_)) {
    if (isRCUPayload != 0) {
      for (local_2050 = 0; local_2050 < 0xf0; local_2050 = local_2050 + 1) {
        imag_f[(long)local_2050 + 0xef] = imag_f[(long)local_2050 + 0xef] * 2.0;
        *(double *)(&n + (long)local_2050 * 2) = *(double *)(&n + (long)local_2050 * 2) * 2.0;
      }
    }
    WebRtcIsac_Spec2time
              (transform_tables,imag_f + 0xef,(double *)&n,halfFrameSecond + 0xef,&local_f38,
               &ISACdecUB_obj->fftstr_obj);
    WebRtcIsac_NormLatticeFilterAr
              (4,(ISACdecUB_obj->maskfiltstr_obj).PostStateLoF,
               (ISACdecUB_obj->maskfiltstr_obj).PostStateLoG,halfFrameSecond + 0xef,
               percepFilterParam + 4,signal_out);
    WebRtcIsac_NormLatticeFilterAr
              (4,(ISACdecUB_obj->maskfiltstr_obj).PostStateLoF,
               (ISACdecUB_obj->maskfiltstr_obj).PostStateLoG,&local_f38,percepFilterParam + 0x22,
               signal_out + 0xf0);
  }
  return transform_tables_local._4_4_;
}

Assistant:

int WebRtcIsac_DecodeUb16(const TransformTables* transform_tables,
                          float* signal_out, ISACUBDecStruct* ISACdecUB_obj,
                          int16_t isRCUPayload) {
  int len, err;

  double halfFrameFirst[FRAMESAMPLES_HALF];
  double halfFrameSecond[FRAMESAMPLES_HALF];

  double percepFilterParam[(UB_LPC_ORDER + 1) * (SUBFRAMES << 1) +
                           (UB_LPC_ORDER + 1)];

  double real_f[FRAMESAMPLES_HALF];
  double imag_f[FRAMESAMPLES_HALF];
  const int16_t kAveragePitchGain = 0; /* No pitch-gain for upper-band. */
  len = 0;

  /* Decode & de-quantize filter coefficients. */
  memset(percepFilterParam, 0, sizeof(percepFilterParam));
  err = WebRtcIsac_DecodeInterpolLpcUb(&ISACdecUB_obj->bitstr_obj,
                                       percepFilterParam, isac16kHz);
  if (err < 0) {
    return err;
  }

  /* Decode & de-quantize spectrum. */
  len = WebRtcIsac_DecodeSpec(&ISACdecUB_obj->bitstr_obj, kAveragePitchGain,
                              kIsacUpperBand16, real_f, imag_f);
  if (len < 0) {
    return len;
  }
  if (isRCUPayload) {
    int n;
    for (n = 0; n < 240; n++) {
      real_f[n] *= RCU_TRANSCODING_SCALE_UB_INVERSE;
      imag_f[n] *= RCU_TRANSCODING_SCALE_UB_INVERSE;
    }
  }
  /* Inverse transform. */
  WebRtcIsac_Spec2time(transform_tables,
                       real_f, imag_f, halfFrameFirst, halfFrameSecond,
                       &ISACdecUB_obj->fftstr_obj);

  /* Perceptual post-filtering (using normalized lattice filter). */
  WebRtcIsac_NormLatticeFilterAr(
      UB_LPC_ORDER, ISACdecUB_obj->maskfiltstr_obj.PostStateLoF,
      (ISACdecUB_obj->maskfiltstr_obj).PostStateLoG, halfFrameFirst,
      &percepFilterParam[(UB_LPC_ORDER + 1)], signal_out);

  WebRtcIsac_NormLatticeFilterAr(
      UB_LPC_ORDER, ISACdecUB_obj->maskfiltstr_obj.PostStateLoF,
      (ISACdecUB_obj->maskfiltstr_obj).PostStateLoG, halfFrameSecond,
      &percepFilterParam[(UB_LPC_ORDER + 1) * SUBFRAMES + (UB_LPC_ORDER + 1)],
      &signal_out[FRAMESAMPLES_HALF]);

  return len;
}